

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorArkode.cpp
# Opt level: O0

int pele::physics::reactions::ReactorArkode::cF_RHS
              (realtype t,N_Vector y_in,N_Vector ydot_in,void *user_data)

{
  undefined4 *in_RDX;
  undefined8 in_XMM0_Qa;
  Real *rYsrc_ext;
  Real *rhoesrc_ext;
  Real *rhoe_init;
  int reactor_type;
  Real dt_save;
  int ncells;
  ARKODEUserData *udata;
  realtype *ydot_d;
  realtype *yvec_d;
  undefined4 in_stack_ffffffffffffff5c;
  
  N_VGetArrayPointer((N_Vector)0x2adf95);
  N_VGetArrayPointer((N_Vector)0x2adfaa);
  *(undefined8 *)(in_RDX + 4) = in_XMM0_Qa;
  amrex::
  ParallelFor<int,pele::physics::reactions::ReactorArkode::cF_RHS(double,_generic_N_Vector*,_generic_N_Vector*,void*)::__0,void>
            ((int)((ulong)*(undefined8 *)(in_RDX + 4) >> 0x20),
             (anon_class_64_8_23bb4f56 *)CONCAT44(in_stack_ffffffffffffff5c,*in_RDX));
  amrex::Gpu::Device::streamSynchronize();
  return 0;
}

Assistant:

int
ReactorArkode::cF_RHS(
  realtype t, N_Vector y_in, N_Vector ydot_in, void* user_data)
{
  BL_PROFILE("Pele::ReactorArkode::cF_RHS()");
#ifdef AMREX_USE_GPU
  realtype* yvec_d = N_VGetDeviceArrayPointer(y_in);
  realtype* ydot_d = N_VGetDeviceArrayPointer(ydot_in);
#else
  realtype* yvec_d = N_VGetArrayPointer(y_in);
  realtype* ydot_d = N_VGetArrayPointer(ydot_in);
#endif

  auto* udata = static_cast<ARKODEUserData*>(user_data);
  udata->dt_save = t;

  const auto ncells = udata->ncells;
  const auto dt_save = udata->dt_save;
  const auto reactor_type = udata->reactor_type;
  auto* rhoe_init = udata->rhoe_init;
  auto* rhoesrc_ext = udata->rhoesrc_ext;
  auto* rYsrc_ext = udata->rYsrc_ext;
  amrex::ParallelFor(udata->ncells, [=] AMREX_GPU_DEVICE(int icell) noexcept {
    utils::fKernelSpec<Ordering>(
      icell, ncells, dt_save, reactor_type, yvec_d, ydot_d, rhoe_init,
      rhoesrc_ext, rYsrc_ext);
  });

  amrex::Gpu::Device::streamSynchronize();

  return (0);
}